

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O2

shared_ptr<KmerList> __thiscall
BatchKmersCounter::buildKMerCount
          (BatchKmersCounter *this,uint8_t K,LongReadsDatastore *reads,uint minCount,string *workdir
          ,string *tmpdir,uchar disk_batches)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  bool bVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  long lVar9;
  size_t new_size;
  int i;
  long lVar10;
  shared_ptr<KmerList> sVar11;
  string local_a98;
  string local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  ofstream kff;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a30 [63];
  uint64_t hist [256];
  
  std::make_shared<KmerList>();
  poVar6 = sdglib::OutputLog(INFO,true);
  poVar6 = std::operator<<(poVar6,"creating kmers from reads...");
  std::endl<char,std::char_traits<char>>(poVar6);
  if (disk_batches < 2) {
    memset(hist,0,0x800);
    kmerCountOMP((BatchKmersCounter *)&kff,K,reads,0,
                 ((long)(reads->read_to_fileRecord).
                        super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(reads->read_to_fileRecord).
                        super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) - 1,0);
    std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)&kff);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a30);
    puVar3 = (undefined8 *)**(long **)this;
    lVar10 = (*(long **)this)[1];
    new_size = 0;
    puVar7 = puVar3;
    for (lVar9 = 0; lVar10 * 0x11 - lVar9 != 0; lVar9 = lVar9 + 0x11) {
      bVar2 = *(byte *)((long)puVar3 + lVar9 + 0x10);
      hist[bVar2] = hist[bVar2] + 1;
      if (minCount <= bVar2) {
        puVar1 = (undefined1 *)((long)puVar3 + lVar9 + 0x10);
        *(undefined1 *)(puVar7 + 2) = *puVar1;
        uVar4 = *(undefined8 *)(puVar1 + -8);
        *puVar7 = *(undefined8 *)(puVar1 + -0x10);
        puVar7[1] = uVar4;
        puVar7 = (undefined8 *)((long)puVar7 + 0x11);
        new_size = new_size + 1;
      }
    }
    poVar6 = sdglib::OutputLog(INFO,true);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"/");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)K);
    poVar6 = std::operator<<(poVar6,"-mers with Freq >= ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    KmerList::resize(*(KmerList **)this,new_size);
    std::operator+(&local_a58,workdir,"/small_K.freqs");
    std::ofstream::ofstream(&kff,(string *)&local_a58,_S_out);
    std::__cxx11::string::~string((string *)&local_a58);
    for (lVar10 = 1; lVar10 != 0x100; lVar10 = lVar10 + 1) {
      poVar6 = (ostream *)std::ostream::operator<<(&kff,(int)lVar10);
      poVar6 = std::operator<<(poVar6,", ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&kff);
    _Var8._M_pi = extraout_RDX_00;
  }
  else {
    bVar5 = std::operator==("",tmpdir);
    if (bVar5) {
      std::__cxx11::string::_M_assign((string *)tmpdir);
    }
    std::__cxx11::string::string((string *)&local_a78,(string *)tmpdir);
    std::__cxx11::string::string((string *)&local_a98,(string *)workdir);
    kmerCountOMPDiskBased
              ((BatchKmersCounter *)hist,K,reads,minCount,&local_a78,&local_a98,disk_batches);
    std::__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2> *)hist);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(hist + 1));
    std::__cxx11::string::~string((string *)&local_a98);
    std::__cxx11::string::~string((string *)&local_a78);
    _Var8._M_pi = extraout_RDX;
  }
  sVar11.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  sVar11.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<KmerList>)sVar11.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::buildKMerCount(uint8_t K, LongReadsDatastore const &reads, unsigned minCount,
                                  std::string workdir, std::string tmpdir, unsigned char disk_batches) {
    std::shared_ptr<KmerList> spectrum=std::make_shared<KmerList>();
    sdglib::OutputLog() << "creating kmers from reads..." << std::endl;
    if (1 >= disk_batches) {
        uint64_t hist[256]={0};
        uint64_t used=0;
        spectrum=kmerCountOMP(K, reads, 0, reads.size(), 0);
        auto witr=spectrum->kmers;
        auto send=spectrum->kmers+spectrum->size;
        for (auto itr=spectrum->kmers;itr!=send;++itr){
            ++hist[itr->count];
            if (itr->count>=minCount) {
                (*witr)=(*itr);
                ++witr;
                ++used;
            }

        }
        sdglib::OutputLog() << used << "/" << spectrum->size << " " << int(K)<<"-mers with Freq >= " << minCount << std::endl;
        spectrum->resize(used);
        std::ofstream kff(workdir + "/small_K.freqs");
        for (auto i = 1; i < 256; i++) kff << i << ", " << hist[i] << std::endl;
        kff.close();
        //todo: filter kmers to minCount
    } else {
        if ("" == tmpdir) tmpdir = workdir;
        spectrum=kmerCountOMPDiskBased(K, reads, minCount, tmpdir, workdir, disk_batches);
    }

    return spectrum;
}